

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QWidgetEffectSourcePrivate * __thiscall
QWidgetEffectSourcePrivate::pixmap
          (QWidgetEffectSourcePrivate *this,CoordinateSystem system,QPoint *offset,
          PixmapPadMode mode)

{
  long *plVar1;
  QWidget *this_00;
  QPoint *pQVar2;
  long lVar3;
  QSize QVar4;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  long lVar5;
  int in_R8D;
  long in_FS_OFFSET;
  double dVar6;
  QRect QVar7;
  undefined1 auVar8 [16];
  QSize local_88;
  QPoint local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined1 local_58 [12];
  undefined4 uStack_4c;
  undefined8 local_48;
  char *pcStack_40;
  long local_38;
  
  lVar5 = CONCAT44(in_register_00000034,system);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((int)offset == 0) && (*(long *)(lVar5 + 0x98) == 0)) {
    local_78._0_4_ = 2;
    local_68._4_4_ = 0;
    local_78._4_4_ = 0;
    uStack_70._0_4_ = 0;
    uStack_70._4_4_ = 0;
    local_68._0_4_ = 0;
    pcStack_60 = "default";
    QMessageLogger::warning
              ((char *)&local_78,
               "QGraphicsEffectSource::pixmap: Not yet implemented, lacking device context");
    QPixmap::QPixmap((QPixmap *)this);
  }
  else {
    local_80.xp.m_i = 0;
    local_80.yp.m_i = 0;
    QVar7 = QWidget::rect(*(QWidget **)(lVar5 + 0x90));
    local_78 = (double)QVar7.x1.m_i.m_i;
    uStack_70 = (double)QVar7.y1.m_i.m_i;
    local_68 = (double)(((long)QVar7.x2.m_i.m_i - (long)QVar7.x1.m_i.m_i) + 1);
    pcStack_60 = (char *)(double)(((QVar7._8_8_ >> 0x20) - (QVar7._0_8_ >> 0x20)) + 1);
    if ((int)offset == 0) {
      pQVar2 = (QPoint *)QPainter::worldTransform();
      QTransform::mapRect((QRectF *)local_58);
      local_68._0_4_ = (undefined4)local_48;
      local_68._4_4_ = local_48._4_4_;
      pcStack_60 = pcStack_40;
      local_78._0_4_ = local_58._0_4_;
      local_78._4_4_ = local_58._4_4_;
      uStack_70._0_4_ = local_58._8_4_;
      uStack_70._4_4_ = uStack_4c;
      local_80 = (QPoint)QTransform::map(pQVar2);
    }
    if (in_R8D == 1) {
      local_58._0_8_ = local_78 + -1.0;
      unique0x10000234 = uStack_70 + -1.0;
      local_48 = local_68 + 1.0 + 1.0;
      dVar6 = (double)pcStack_60 + 1.0 + 1.0;
      auVar8._8_4_ = SUB84(dVar6,0);
      auVar8._0_8_ = local_48;
      auVar8._12_4_ = (int)((ulong)dVar6 >> 0x20);
      pcStack_40 = auVar8._8_8_;
    }
    else if (in_R8D == 2) {
      plVar1 = *(long **)(*(long *)(*(long *)(lVar5 + 0x90) + 8) + 200);
      (**(code **)(*plVar1 + 0x60))(local_58,plVar1,&local_78);
    }
    auVar8 = QRectF::toAlignedRect();
    if ((undefined8 *)CONCAT44(in_register_0000000c,mode) != (undefined8 *)0x0) {
      *(undefined8 *)CONCAT44(in_register_0000000c,mode) = auVar8._0_8_;
    }
    local_80.yp.m_i = local_80.yp.m_i - auVar8._4_4_;
    local_80.xp.m_i = local_80.xp.m_i - auVar8._0_4_;
    lVar3 = QPainter::device();
    if (lVar3 == 0) {
      local_58._0_4_ = 2;
      local_48._4_4_ = 0;
      local_58._4_4_ = 0;
      local_58._8_4_ = 0;
      uStack_4c = 0;
      local_48._0_4_ = 0;
      pcStack_40 = "default";
      QMessageLogger::warning(local_58,"QWidgetEffectSourcePrivate::pixmap: Painter not active");
      dVar6 = 1.0;
    }
    else {
      dVar6 = (double)QPaintDevice::devicePixelRatio();
    }
    *(undefined1 **)&(this->super_QGraphicsEffectSourcePrivate).field_0x10 = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&this->super_QGraphicsEffectSourcePrivate = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(this->super_QGraphicsEffectSourcePrivate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
    local_88.wd.m_i = (auVar8._8_4_ - auVar8._0_4_) + 1;
    local_88.ht.m_i = (auVar8._12_4_ - auVar8._4_4_) + 1;
    QVar4 = operator*(&local_88,dVar6);
    local_58._0_4_ = QVar4.wd.m_i;
    local_58._4_4_ = QVar4.ht.m_i;
    QPixmap::QPixmap((QPixmap *)this,(QSize *)local_58);
    QPixmap::setDevicePixelRatio(dVar6);
    QColor::QColor((QColor *)local_58,transparent);
    QPixmap::fill((QColor *)this);
    this_00 = *(QWidget **)(lVar5 + 0x90);
    QRegion::QRegion((QRegion *)local_58);
    QWidget::render(this_00,(QPaintDevice *)this,&local_80,(QRegion *)local_58,(RenderFlags)0x2);
    QRegion::~QRegion((QRegion *)local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QPixmap QWidgetEffectSourcePrivate::pixmap(Qt::CoordinateSystem system, QPoint *offset,
                                           QGraphicsEffect::PixmapPadMode mode) const
{
    const bool deviceCoordinates = (system == Qt::DeviceCoordinates);
    if (Q_UNLIKELY(!context && deviceCoordinates)) {
        // Device coordinates without context not yet supported.
        qWarning("QGraphicsEffectSource::pixmap: Not yet implemented, lacking device context");
        return QPixmap();
    }

    QPoint pixmapOffset;
    QRectF sourceRect = m_widget->rect();

    if (deviceCoordinates) {
        const QTransform &painterTransform = context->painter->worldTransform();
        sourceRect = painterTransform.mapRect(sourceRect);
        pixmapOffset = painterTransform.map(pixmapOffset);
    }

    QRect effectRect;

    if (mode == QGraphicsEffect::PadToEffectiveBoundingRect)
        effectRect = m_widget->graphicsEffect()->boundingRectFor(sourceRect).toAlignedRect();
    else if (mode == QGraphicsEffect::PadToTransparentBorder)
        effectRect = sourceRect.adjusted(-1, -1, 1, 1).toAlignedRect();
    else
        effectRect = sourceRect.toAlignedRect();

    if (offset)
        *offset = effectRect.topLeft();

    pixmapOffset -= effectRect.topLeft();

    qreal dpr(1.0);
    if (const auto *paintDevice = context->painter->device())
        dpr = paintDevice->devicePixelRatio();
    else
        qWarning("QWidgetEffectSourcePrivate::pixmap: Painter not active");
    QPixmap pixmap(effectRect.size() * dpr);
    pixmap.setDevicePixelRatio(dpr);

    pixmap.fill(Qt::transparent);
    m_widget->render(&pixmap, pixmapOffset, QRegion(), QWidget::DrawChildren);
    return pixmap;
}